

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Reg1(ByteCodeWriter *this,OpCode op,RegSlot R0)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  RegSlot local_2c [2];
  OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x1);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x16a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088c30e;
    *puVar3 = 0;
  }
  if (R0 != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088c30e;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    R0_00 = FunctionBody::MapRegSlot(this_00,R0);
    bVar2 = TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00);
    if (!bVar2) {
      bVar2 = TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00);
      if (!bVar2) {
        local_2c[0] = R0_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,local_2c,4);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0088c30e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg1(OpCode op, RegSlot R0)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        MULTISIZE_LAYOUT_WRITE(Reg1, op, R0);
    }